

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qplaintextedit.cpp
# Opt level: O0

int __thiscall
QPlainTextDocumentLayout::hitTest
          (QPlainTextDocumentLayout *this,QPointF *param_1,HitTestAccuracy param_2)

{
  HitTestAccuracy param_2_local;
  QPointF *param_1_local;
  QPlainTextDocumentLayout *this_local;
  
  return -1;
}

Assistant:

int QPlainTextDocumentLayout::hitTest(const QPointF &, Qt::HitTestAccuracy ) const
{
//     this function is used from
//     QAbstractTextDocumentLayout::anchorAt(), but is not
//     implementable in a plain text document layout, because the
//     layout depends on the top block and top line which depends on
//     the view
    return -1;
}